

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

int __thiscall
boost::deflate::deflate_stream_test::BoostCompressor::init(BoostCompressor *this,EVP_PKEY_CTX *ctx)

{
  int level;
  Strategy strategy;
  int extraout_EAX;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  int local_20;
  int local_1c;
  int strategy_local;
  int memLevel_local;
  int windowBits_local;
  int level_local;
  BoostCompressor *this_local;
  
  memLevel_local = (int)ctx;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_38 = 0;
  local_30 = 0;
  local_28 = 2;
  local_24 = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  strategy_local = in_EDX;
  _windowBits_local = this;
  memcpy(&this->zp,&local_58,0x38);
  deflate_stream::clear(&this->ds);
  level = memLevel_local;
  strategy = toStrategy(local_20);
  deflate_stream::reset(&this->ds,level,strategy_local,local_1c,strategy,none);
  return extraout_EAX;
}

Assistant:

void init(
            int level,
            int windowBits,
            int memLevel,
            int strategy) override
        {
            zp = {};
            ds.clear();
            ds.reset(
                level,
                windowBits,
                memLevel,
                toStrategy(strategy));
        }